

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::fixup_image_load_store_access(CompilerGLSL *this)

{
  ParsedIR *this_00;
  ID id;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  bool bVar3;
  SPIRType *pSVar4;
  long lVar5;
  LoopLock LStack_38;
  
  if ((this->options).enable_storage_image_qualifier_deduction == true) {
    this_00 = &(this->super_Compiler).ir;
    ParsedIR::create_loop_hard_lock(this_00);
    pTVar1 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    sVar2 = (this->super_Compiler).ir.ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    for (lVar5 = 0; sVar2 << 2 != lVar5; lVar5 = lVar5 + 4) {
      id.id = *(uint32_t *)((long)&pTVar1->id + lVar5);
      if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[id.id].type ==
          TypeVariable) {
        ParsedIR::get<spirv_cross::SPIRVariable>(this_00,id.id);
        pSVar4 = Compiler::expression_type(&this->super_Compiler,id.id);
        if ((*(int *)&(pSVar4->super_IVariant).field_0xc == 0x10) && ((pSVar4->image).sampled == 2))
        {
          bVar3 = Compiler::has_decoration(&this->super_Compiler,id,DecorationNonWritable);
          if (!bVar3) {
            bVar3 = Compiler::has_decoration(&this->super_Compiler,id,DecorationNonReadable);
            if (!bVar3) {
              Compiler::set_decoration(&this->super_Compiler,id,DecorationNonWritable,0);
              Compiler::set_decoration(&this->super_Compiler,id,DecorationNonReadable,0);
            }
          }
        }
      }
    }
    ParsedIR::LoopLock::~LoopLock(&LStack_38);
  }
  return;
}

Assistant:

void CompilerGLSL::fixup_image_load_store_access()
{
	if (!options.enable_storage_image_qualifier_deduction)
		return;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t var, const SPIRVariable &) {
		auto &vartype = expression_type(var);
		if (vartype.basetype == SPIRType::Image && vartype.image.sampled == 2)
		{
			// Very old glslangValidator and HLSL compilers do not emit required qualifiers here.
			// Solve this by making the image access as restricted as possible and loosen up if we need to.
			// If any no-read/no-write flags are actually set, assume that the compiler knows what it's doing.

			if (!has_decoration(var, DecorationNonWritable) && !has_decoration(var, DecorationNonReadable))
			{
				set_decoration(var, DecorationNonWritable);
				set_decoration(var, DecorationNonReadable);
			}
		}
	});
}